

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsHeader.h
# Opt level: O0

void __thiscall AoEHeader::AoEHeader(AoEHeader *this)

{
  AoEHeader *this_local;
  
  AmsNetId::AmsNetId(&this->targetNetId,0);
  this->leTargetPort = 0;
  AmsNetId::AmsNetId(&this->sourceNetId,0);
  this->leSourcePort = 0;
  this->leCmdId = 0;
  this->leStateFlags = 0;
  this->leLength = 0;
  this->leErrorCode = 0;
  this->leInvokeId = 0;
  return;
}

Assistant:

AoEHeader()
        : leTargetPort(0),
        leSourcePort(0),
        leCmdId(0),
        leStateFlags(0),
        leLength(0),
        leErrorCode(0),
        leInvokeId(0)
    {}